

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O2

SquareMatrix<float> * __thiscall
qclab::dense::SquareMatrix<float>::operator=(SquareMatrix<float> *this,SquareMatrix<float> *matrix)

{
  float *pfVar1;
  float *pfVar2;
  pointer __p;
  int64_t i;
  ulong uVar3;
  long lVar4;
  pointer local_20;
  
  lVar4 = matrix->size_;
  if (lVar4 != this->size_) {
    this->size_ = lVar4;
    alloc_unique_array<float>((dense *)&local_20,lVar4 * lVar4);
    __p = local_20;
    local_20 = (pointer)0x0;
    std::__uniq_ptr_impl<float,_std::default_delete<float[]>_>::reset
              ((__uniq_ptr_impl<float,_std::default_delete<float[]>_> *)&this->data_,__p);
    std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr
              ((unique_ptr<float[],_std::default_delete<float[]>_> *)&local_20);
    lVar4 = this->size_;
  }
  pfVar1 = (matrix->data_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
           super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
           super__Head_base<0UL,_float_*,_false>._M_head_impl;
  pfVar2 = (this->data_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
           super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
           super__Head_base<0UL,_float_*,_false>._M_head_impl;
  for (uVar3 = 0; uVar3 < (ulong)(lVar4 * lVar4); uVar3 = uVar3 + 1) {
    pfVar2[uVar3] = pfVar1[uVar3];
  }
  return this;
}

Assistant:

SquareMatrix< T >& operator=( const SquareMatrix< T >& matrix ) {
          if ( matrix.size() != size_ ) {
            size_ = matrix.size() ;
            data_ = std::move( alloc_unique_array< T >( size_ * size_ ) ) ;
          }
          const T* data = matrix.ptr() ;
          #pragma omp parallel for
          for ( int64_t i = 0; i < size_*size_; i++ ) {
            data_[i] = data[i] ;
          }
          return *this ;
        }